

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::flushCriticalInfo(SimpleLoggerMgr *this)

{
  char cVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string msg;
  string local_28;
  
  std::__cxx11::string::string
            ((string *)&msg," === Critical info (given by user): ",(allocator *)&bStack_68);
  std::__cxx11::to_string(&local_28,(this->globalCriticalInfo)._M_string_length);
  std::operator+(&bStack_68,&local_28," bytes");
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::append((char *)&msg);
  if ((this->globalCriticalInfo)._M_string_length != 0) {
    std::operator+(&bStack_68,"\n",&this->globalCriticalInfo);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&bStack_68);
  }
  flushAllLoggers(this,2,&msg);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&this->crashDumpFile,(string *)&msg);
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void SimpleLoggerMgr::flushCriticalInfo() {
    std::string msg = " === Critical info (given by user): ";
    msg += std::to_string(globalCriticalInfo.size()) + " bytes";
    msg += " ===";
    if (!globalCriticalInfo.empty()) {
        msg += "\n" + globalCriticalInfo;
    }
    flushAllLoggers(2, msg);
    if (crashDumpFile.is_open()) {
        crashDumpFile << msg << std::endl << std::endl;
    }
}